

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# swap_vliet.c
# Opt level: O0

void swap_gauss(float *c,float *b,int w,int h,double s)

{
  double in_XMM0_Qa;
  double filter [7];
  double *in_stack_00000068;
  int in_stack_00000070;
  int in_stack_00000074;
  float *in_stack_00000078;
  float *in_stack_00000080;
  double *in_stack_00000098;
  int in_stack_000000a0;
  int in_stack_000000a4;
  float *in_stack_000000a8;
  float *in_stack_000000b0;
  double adStack_58 [11];
  
  YvVfilterCoef(in_XMM0_Qa,adStack_58);
  xline(in_stack_00000080,in_stack_00000078,in_stack_00000074,in_stack_00000070,in_stack_00000068);
  yline(in_stack_000000b0,in_stack_000000a8,in_stack_000000a4,in_stack_000000a0,in_stack_00000098);
  return;
}

Assistant:

void swap_gauss(SRCTYPE *c, DSTTYPE *b, int w, int h, double s) {
    double filter[7];

    /* calculate filter coefficients of x-direction */
    YvVfilterCoef(s, filter);
    /* filter in the x-direction */
    xline(c, b, w, h, filter);
    /* calculate filter coefficients in tanp-direction */
    /* YvVfilterCoef(s, filter); */
    yline(b, b, w, h, filter);
}